

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

const_iterator * __thiscall
llvm::sys::path::begin(const_iterator *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  path pVar1;
  int iVar2;
  char *pcVar3;
  Style SVar4;
  size_t From;
  uint uVar5;
  char *pcVar6;
  StringRef Chars;
  StringRef local_38;
  
  pcVar6 = path.Data;
  SVar4 = (Style)path.Length;
  (__return_storage_ptr__->Path).Data = (char *)this;
  (__return_storage_ptr__->Path).Length = (size_t)pcVar6;
  if (pcVar6 == (char *)0x0) {
    pcVar3 = (char *)0x0;
    goto LAB_0014e4e3;
  }
  pVar1 = *this;
  uVar5 = (uint)(byte)pVar1;
  local_38.Data = (char *)this;
  local_38.Length = (size_t)pcVar6;
  if (SVar4 == windows) {
    if (pcVar6 != (char *)0x1) {
      iVar2 = isalpha(uVar5);
      if ((iVar2 != 0) && (pcVar3 = (char *)0x2, this[1] == (path)0x3a)) goto LAB_0014e4e3;
      goto LAB_0014e428;
    }
LAB_0014e492:
    pcVar3 = (char *)0x1;
    if ((uVar5 == 0x2f) || (uVar5 == 0x5c && SVar4 == windows)) goto LAB_0014e4e3;
LAB_0014e4aa:
    pcVar6 = "/";
    if (SVar4 == windows) {
      pcVar6 = "\\/";
    }
    From = 0;
  }
  else {
LAB_0014e428:
    if (pcVar6 < (char *)0x3) goto LAB_0014e492;
    if ((uVar5 != 0x2f) && (uVar5 != 0x5c || SVar4 != windows)) goto LAB_0014e4aa;
    if (pVar1 != this[1]) goto LAB_0014e492;
    if ((this[2] == (path)0x2f) || (SVar4 == windows && this[2] == (path)0x5c)) goto LAB_0014e492;
    pcVar6 = "/";
    if (SVar4 == windows) {
      pcVar6 = "\\/";
    }
    From = 2;
  }
  Chars.Length = (ulong)(SVar4 == windows) + 1;
  Chars.Data = pcVar6;
  pcVar3 = (char *)StringRef::find_first_of(&local_38,Chars,From);
  this = (path *)local_38.Data;
  if (local_38.Length < pcVar3) {
    pcVar3 = (char *)local_38.Length;
  }
LAB_0014e4e3:
  (__return_storage_ptr__->Component).Data = (char *)this;
  (__return_storage_ptr__->Component).Length = (size_t)pcVar3;
  __return_storage_ptr__->Position = 0;
  __return_storage_ptr__->S = SVar4;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin(StringRef path, Style style) {
  const_iterator i;
  i.Path      = path;
  i.Component = find_first_component(path, style);
  i.Position  = 0;
  i.S = style;
  return i;
}